

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

int llvm::APInt::tcCompare(WordType *lhs,WordType *rhs,uint parts)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = (ulong)parts;
  do {
    bVar2 = uVar1 == 0;
    uVar1 = uVar1 - 1;
    if (bVar2) {
      return 0;
    }
  } while (lhs[uVar1] == rhs[uVar1]);
  return (rhs[uVar1] < lhs[uVar1]) - 1 | 1;
}

Assistant:

int APInt::tcCompare(const WordType *lhs, const WordType *rhs,
                     unsigned parts) {
  while (parts) {
    parts--;
    if (lhs[parts] != rhs[parts])
      return (lhs[parts] > rhs[parts]) ? 1 : -1;
  }

  return 0;
}